

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

uint Validator::constraintS5(Solution *solution)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *this;
  Scenario *this_00;
  Nurse *this_01;
  string *psVar2;
  string local_98;
  Contract local_78;
  reference local_38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *nurse;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range1;
  uint sum;
  Solution *solution_local;
  
  __range1._4_4_ = 0;
  this = Solution::getNurses_abi_cxx11_(solution);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
           ::begin(this);
  nurse = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::end(this);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&nurse), bVar1) {
    local_38 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
               ::operator*(&__end1);
    this_00 = Scenario::getInstance();
    this_01 = NurseSolution::getNurse(local_38->second);
    psVar2 = Nurse::getContract_abi_cxx11_(this_01);
    std::__cxx11::string::string((string *)&local_98,(string *)psVar2);
    Scenario::getContract(&local_78,this_00,&local_98);
    bVar1 = Contract::getCompleteWeekends(&local_78);
    Contract::~Contract(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    if ((bVar1) && (bVar1 = nurseWorkingHalfWeekEnd(local_38->second), bVar1)) {
      __range1._4_4_ = __range1._4_4_ + 0x1e;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned int Validator::constraintS5(const Solution &solution) {

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
        if(Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getCompleteWeekends())
            {
                if(nurseWorkingHalfWeekEnd(nurse.second))
                    sum += 30;
            }
    return sum;
}